

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

void Json::stream(Value *jv,write_t *write)

{
  function<void_(const_void_*,_unsigned_long)> local_38;
  write_t *local_18;
  write_t *write_local;
  Value *jv_local;
  
  local_18 = write;
  write_local = (write_t *)jv;
  std::function<void_(const_void_*,_unsigned_long)>::function(&local_38,write);
  detail::write_value(&local_38,(Value *)write_local);
  std::function<void_(const_void_*,_unsigned_long)>::~function(&local_38);
  std::function<void_(const_void_*,_unsigned_long)>::operator()(write,"\n",1);
  return;
}

Assistant:

void
stream (Json::Value const& jv, write_t write)
{
    detail::write_value(write, jv);
    write("\n", 1);
}